

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O0

void __thiscall flow::BasicBlock::~BasicBlock(BasicBlock *this)

{
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  reference ppBVar3;
  BasicBlock *bb_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *__range1_1;
  BasicBlock *bb;
  iterator __end1;
  iterator __begin1;
  vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *__range1;
  string local_38 [32];
  undefined1 local_18 [16];
  BasicBlock *this_local;
  
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__BasicBlock_002ca338;
  local_18._8_8_ = this;
  while( true ) {
    bVar1 = empty(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    back(this);
    remove((BasicBlock *)local_18,(char *)this);
    std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr
              ((unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)local_18);
  }
  bVar1 = std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::empty
                    (&this->predecessors_);
  __stream = _stderr;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_38,"Cannot remove a BasicBlock that another BasicBlock still refers to.",
               (allocator<char> *)((long)&__range1 + 7));
    uVar2 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s\n",uVar2);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    abort();
  }
  __end1 = std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::begin
                     (&this->predecessors_);
  bb = (BasicBlock *)
       std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::end
                 (&this->predecessors_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
                                *)&bb);
    if (!bVar1) break;
    ppBVar3 = __gnu_cxx::
              __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
              ::operator*(&__end1);
    unlinkSuccessor(*ppBVar3,this);
    __gnu_cxx::
    __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::begin
                       (&this->successors_);
  bb_1 = (BasicBlock *)
         std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::end
                   (&this->successors_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
                        *)&bb_1);
    if (!bVar1) break;
    ppBVar3 = __gnu_cxx::
              __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
              ::operator*(&__end1_1);
    unlinkSuccessor(this,*ppBVar3);
    __gnu_cxx::
    __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::~vector(&this->successors_);
  std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::~vector
            (&this->predecessors_);
  std::
  vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
  ::~vector(&this->code_);
  Value::~Value(&this->super_Value);
  return;
}

Assistant:

BasicBlock::~BasicBlock() {
  // XXX we *must* destruct the code in reverse order to ensure proper release
  // The validity checks will fail otherwise.
  while (!empty()) {
    remove(back());
  }

  FLOW_ASSERT(predecessors_.empty(),
              "Cannot remove a BasicBlock that another BasicBlock still refers to.");

  for (BasicBlock* bb : predecessors_) {
    bb->unlinkSuccessor(this);
  }

  for (BasicBlock* bb : successors_) {
    unlinkSuccessor(bb);
  }
}